

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

void __thiscall Corrade::Utility::StringStream::overflow(StringStream *this)

{
  int_type in_ESI;
  
  overflow((StringStream *)&this[-1].field_0x170,in_ESI);
  return;
}

Assistant:

std::streambuf::int_type overflow(std::streambuf::int_type ch) override {
            /* Not sure when this could happen, and the STL docs aren't helpful
               either. Plus, which madman did this comparison?! */
            CORRADE_INTERNAL_DEBUG_ASSERT(!std::char_traits<char>::eq_int_type(ch, std::char_traits<char>::eof()));

            /* If overflow() was not called yet or sync() got called right
               before (for example from a Debug instance being destructed in
               nested scope), the data are owned by the string. Transfer them
               to the array. */
            if(!_data) {
                /* If the string is a SSO (i.e., or also empty), the conversion
                   would allocate, which we would immediately replace with a
                   growing allocation, so just put it into a growing allocation
                   already. It's next to impossible to verify that the
                   unnecessary extra allocation indeed wasn't done, though, so
                   the test for this branch relies on `operator Array&&`
                   clearing the contents.

                   The string can also become a SSO subsequently, not only for
                   the very first time, for example when it's emptied /
                   replaced by the caller. */
                if(_out.isSmall())
                    arrayAppend(_data, _out);
                else
                    _data = Utility::move(_out);

                /* All that's in the array should now be preserved, appending
                   only after. Call setp() to update the pointer to reflect
                   the data array. If this is called after sync() with the
                   string not being touched in meanwhile, the setp() sets the
                   same values as before. */
                _initialSize = _data.size();
                setp(_data.begin() + _initialSize, _data.end());
            }

            /* Append the overflowing char, which in turn may grow the capacity
               in some way. */
            arrayAppend(_data, char(ch));
            /* ASan container annotations would complain if the stream would
               write to the capacity, so resize it to match the capacity. The
               actual end pointer is then queried only when converting to a
               string at the end. */
            arrayResize(_data, NoInit, arrayCapacity(_data));

            /* The above might have reallocated, call setp() to update the
               pointer for next insertion. Again, all that has been written so
               far including the one overflowing char, is meant to be
               preserved, appending only after. */
            _initialSize += pptr() - pbase() + 1;
            setp(_data.begin() + _initialSize, _data.end());

            /* The docs say it should return a non-EOF value on success. Is 0 a
               non-EOF value?! I have no idea. I'll just return what I
               received, so if that's an EOF, so be it. */
            return ch;
        }